

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O0

int XmlUtf8Encode(int c,char *buf)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  char *buf_local;
  int c_local;
  
  if (c < 0) {
    buf_local._4_4_ = 0;
  }
  else {
    bVar3 = (byte)c;
    if (c < 0x80) {
      *buf = bVar3;
      buf_local._4_4_ = 1;
    }
    else {
      bVar1 = (byte)(c >> 6);
      if (c < 0x800) {
        *buf = bVar1 | 0xc0;
        buf[1] = bVar3 & 0x3f | 0x80;
        buf_local._4_4_ = 2;
      }
      else {
        bVar2 = (byte)(c >> 0xc);
        if (c < 0x10000) {
          *buf = bVar2 | 0xe0;
          buf[1] = bVar1 & 0x3f | 0x80;
          buf[2] = bVar3 & 0x3f | 0x80;
          buf_local._4_4_ = 3;
        }
        else if (c < 0x110000) {
          *buf = (byte)(c >> 0x12) | 0xf0;
          buf[1] = bVar2 & 0x3f | 0x80;
          buf[2] = bVar1 & 0x3f | 0x80;
          buf[3] = bVar3 & 0x3f | 0x80;
          buf_local._4_4_ = 4;
        }
        else {
          buf_local._4_4_ = 0;
        }
      }
    }
  }
  return buf_local._4_4_;
}

Assistant:

int FASTCALL
XmlUtf8Encode(int c, char *buf)
{
  enum {
    /* minN is minimum legal resulting value for N byte sequence */
    min2 = 0x80,
    min3 = 0x800,
    min4 = 0x10000
  };

  if (c < 0)
    return 0;
  if (c < min2) {
    buf[0] = (char)(c | UTF8_cval1);
    return 1;
  }
  if (c < min3) {
    buf[0] = (char)((c >> 6) | UTF8_cval2);
    buf[1] = (char)((c & 0x3f) | 0x80);
    return 2;
  }
  if (c < min4) {
    buf[0] = (char)((c >> 12) | UTF8_cval3);
    buf[1] = (char)(((c >> 6) & 0x3f) | 0x80);
    buf[2] = (char)((c & 0x3f) | 0x80);
    return 3;
  }
  if (c < 0x110000) {
    buf[0] = (char)((c >> 18) | UTF8_cval4);
    buf[1] = (char)(((c >> 12) & 0x3f) | 0x80);
    buf[2] = (char)(((c >> 6) & 0x3f) | 0x80);
    buf[3] = (char)((c & 0x3f) | 0x80);
    return 4;
  }
  return 0;
}